

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O2

void compareB44(int width,int height,Array2D<Imath_3_2::half> *p1,Array2D<Imath_3_2::half> *p2)

{
  long lVar1;
  half *phVar2;
  long lVar3;
  half *phVar4;
  bool bVar5;
  half *phVar6;
  half *phVar7;
  long lVar8;
  uint uVar9;
  int x1;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  half B [4] [4];
  half A [4] [4];
  half local_78 [16];
  half local_58 [20];
  
  lVar1 = p1->_sizeY;
  phVar2 = p1->_data;
  lVar3 = p2->_sizeY;
  phVar4 = p2->_data;
  lVar13 = 0;
  do {
    if (height <= lVar13) {
      return;
    }
    for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 4) {
      phVar6 = local_78;
      phVar7 = local_58;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar9 = (uint)lVar8 | (uint)lVar13;
        if ((int)(height - 1U) < (int)uVar9) {
          uVar9 = height - 1U;
        }
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          iVar11 = (int)lVar12 + (int)lVar10;
          if (width + -1 < iVar11) {
            iVar11 = width + -1;
          }
          phVar7[lVar10]._h = phVar2[lVar1 * (int)uVar9 + (long)iVar11]._h;
          phVar6[lVar10]._h = phVar4[(int)uVar9 * lVar3 + (long)iVar11]._h;
        }
        phVar7 = phVar7 + 4;
        phVar6 = phVar6 + 4;
      }
      bVar5 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
      if (!bVar5) {
        __assert_fail("withinB44ErrorBounds (A, B)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                      ,0xc4,
                      "void compareB44(int, int, const Array2D<half> &, const Array2D<half> &)");
      }
    }
    lVar13 = lVar13 + 4;
  } while( true );
}

Assistant:

void
compareB44 (
    int width, int height, const Array2D<half>& p1, const Array2D<half>& p2)
{
    for (int y = 0; y < height; y += 4)
    {
        for (int x = 0; x < width; x += 4)
        {
            half A[4][4];
            half B[4][4];

            for (int y1 = 0; y1 < 4; ++y1)
            {
                for (int x1 = 0; x1 < 4; ++x1)
                {
                    int y2    = min (y + y1, height - 1);
                    int x2    = min (x + x1, width - 1);
                    A[y1][x1] = p1[y2][x2];
                    B[y1][x1] = p2[y2][x2];
                }
            }

            assert (withinB44ErrorBounds (A, B));
        }
    }
}